

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV2MeshBlock(Parser *this,Mesh *mesh)

{
  bool bVar1;
  uint local_38;
  uint local_34;
  uint iIndex;
  uint iNumCFaces;
  uint iNumCVertices;
  uint iNumTFaces;
  uint iNumTVertices;
  uint iNumFaces;
  uint iNumVertices;
  int iDepth;
  Mesh *mesh_local;
  Parser *this_local;
  
  iNumFaces = 0;
  iNumTVertices = 0;
  iNumTFaces = 0;
  iNumCVertices = 0;
  iNumCFaces = 0;
  iIndex = 0;
  local_34 = 0;
  _iNumVertices = mesh;
  mesh_local = (Mesh *)this;
LAB_005c6789:
  do {
    while (*this->filePtr != '*') {
LAB_005c6b10:
      if (*this->filePtr == '{') {
        iNumFaces = iNumFaces + 1;
      }
      else if (*this->filePtr == '}') {
        iNumFaces = iNumFaces - 1;
        if (iNumFaces == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH chunk (Level 2)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMVERTEX",0xe);
    if (bVar1) {
      ParseLV4MeshLong(this,&iNumTVertices);
      goto LAB_005c6789;
    }
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVERTEX",0xf);
    if (!bVar1) {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMCVERTEX",0xf);
      if (bVar1) {
        ParseLV4MeshLong(this,&iIndex);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMFACES",0xd);
        if (bVar1) {
          ParseLV4MeshLong(this,&iNumTFaces);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVFACES",0xf);
          if (bVar1) {
            ParseLV4MeshLong(this,&iNumCFaces);
          }
          else {
            bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMCVFACES",0xf);
            if (bVar1) {
              ParseLV4MeshLong(this,&local_34);
            }
            else {
              bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTEX_LIST",0x10);
              if (bVar1) {
                ParseLV3MeshVertexListBlock(this,iNumTVertices,_iNumVertices);
              }
              else {
                bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_FACE_LIST",0xe);
                if (bVar1) {
                  ParseLV3MeshFaceListBlock(this,iNumTFaces,_iNumVertices);
                }
                else {
                  bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_TVERTLIST",0xe);
                  if (bVar1) {
                    ParseLV3MeshTListBlock(this,iNumCVertices,_iNumVertices,0);
                  }
                  else {
                    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_TFACELIST",0xe);
                    if (bVar1) {
                      ParseLV3MeshTFaceListBlock(this,iNumCFaces,_iNumVertices,0);
                    }
                    else {
                      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_CVERTLIST",0xe);
                      if (bVar1) {
                        ParseLV3MeshCListBlock(this,iIndex,_iNumVertices);
                      }
                      else {
                        bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_CFACELIST",0xe);
                        if (!bVar1) {
                          bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NORMALS",0xc);
                          if (bVar1) {
                            ParseLV3MeshNormalListBlock(this,_iNumVertices);
                            goto LAB_005c6789;
                          }
                          bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_MAPPINGCHANNEL",0x13);
                          if (bVar1) {
                            local_38 = 0;
                            ParseLV4MeshLong(this,&local_38);
                            if (local_38 != 0) {
                              if (local_38 < 2) {
                                LogWarning(this,
                                           "Mapping channel has an invalid index. Skipping UV channel"
                                          );
                                SkipSection(this);
                              }
                              if (local_38 < 9) {
                                ParseLV3MappingChannel(this,local_38 - 1,_iNumVertices);
                              }
                              else {
                                LogWarning(this,
                                           "Too many UV channels specified. Skipping channel ..");
                                SkipSection(this);
                              }
                              goto LAB_005c6789;
                            }
                            LogWarning(this,
                                       "Mapping channel has an invalid index. Skipping UV channel");
                            SkipSection(this);
                          }
                          bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_ANIMATION",0xe);
                          if (bVar1) {
                            LogWarning(this,
                                       "Found *MESH_ANIMATION element in ASE/ASK file. Keyframe animation is not supported by Assimp, this element will be ignored"
                                      );
                          }
                          else {
                            bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_WEIGHTS",0xc);
                            if (!bVar1) goto LAB_005c6b10;
                            ParseLV3MeshWeightsBlock(this,_iNumVertices);
                          }
                          goto LAB_005c6789;
                        }
                        ParseLV3MeshCFaceListBlock(this,local_34,_iNumVertices);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_005c6789;
    }
    ParseLV4MeshLong(this,&iNumCVertices);
  } while( true );
}

Assistant:

void Parser::ParseLV2MeshBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0;
    unsigned int iNumFaces = 0;
    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    unsigned int iNumCVertices = 0;
    unsigned int iNumCFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // Number of vertices in the mesh
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of vertex colors in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumCVertices);
                continue;
            }
            // Number of regular faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMFACES" ,13))
            {
                ParseLV4MeshLong(iNumFaces);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // Number of colored faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVFACES" ,15))
            {
                ParseLV4MeshLong(iNumCFaces);
                continue;
            }
            // mesh vertex list block
            if (TokenMatch(filePtr,"MESH_VERTEX_LIST" ,16))
            {
                ParseLV3MeshVertexListBlock(iNumVertices,mesh);
                continue;
            }
            // mesh face list block
            if (TokenMatch(filePtr,"MESH_FACE_LIST" ,14))
            {
                ParseLV3MeshFaceListBlock(iNumFaces,mesh);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh);
                continue;
            }
            // mesh color vertex list block
            if (TokenMatch(filePtr,"MESH_CVERTLIST" ,14))
            {
                ParseLV3MeshCListBlock(iNumCVertices,mesh);
                continue;
            }
            // mesh color face block
            if (TokenMatch(filePtr,"MESH_CFACELIST" ,14))
            {
                ParseLV3MeshCFaceListBlock(iNumCFaces,mesh);
                continue;
            }
            // mesh normals
            if (TokenMatch(filePtr,"MESH_NORMALS" ,12))
            {
                ParseLV3MeshNormalListBlock(mesh);
                continue;
            }
            // another mesh UV channel ...
            if (TokenMatch(filePtr,"MESH_MAPPINGCHANNEL" ,19)) {
                unsigned int iIndex( 0 );
                ParseLV4MeshLong(iIndex);
                if ( 0 == iIndex ) {
                    LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                    // skip it ...
                    SkipSection();
                } else {
                    if ( iIndex < 2 ) {
                        LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                        // skip it ...
                        SkipSection();
                    }
                    if ( iIndex > AI_MAX_NUMBER_OF_TEXTURECOORDS ) {
                        LogWarning( "Too many UV channels specified. Skipping channel .." );
                        // skip it ...
                        SkipSection();
                    } else {
                        // parse the mapping channel
                        ParseLV3MappingChannel( iIndex - 1, mesh );
                    }
                    continue;
                }
            }
            // mesh animation keyframe. Not supported
            if (TokenMatch(filePtr,"MESH_ANIMATION" ,14))
            {

                LogWarning("Found *MESH_ANIMATION element in ASE/ASK file. "
                    "Keyframe animation is not supported by Assimp, this element "
                    "will be ignored");
                //SkipSection();
                continue;
            }
            if (TokenMatch(filePtr,"MESH_WEIGHTS" ,12))
            {
                ParseLV3MeshWeightsBlock(mesh);continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MESH");
    }
    return;
}